

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O1

BaseState<true> * __thiscall
DefaultState<true>::EndObject(DefaultState<true> *this,Context<true> *ctx,SizeType memberCount)

{
  uint uVar1;
  example **ppeVar2;
  BaseState<true> *pBVar3;
  stringstream *psVar4;
  ostream *poVar5;
  
  pBVar3 = Context<true>::PopNamespace(ctx);
  if ((ctx->namespace_path).super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (ctx->namespace_path).super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar1 = (ctx->label_index_state).index;
    if (-1 < (int)uVar1) {
      ppeVar2 = ctx->examples->_begin;
      if ((int)((ulong)((long)ctx->examples->_end - (long)ppeVar2) >> 3) <= (int)(uVar1 + 1)) {
        psVar4 = Context<true>::error_abi_cxx11_(ctx);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(psVar4 + 0x10),
                   "Out of bounds error: _labelIndex must be smaller than number of actions! _labelIndex="
                   ,0x55);
        poVar5 = (ostream *)std::ostream::operator<<(psVar4 + 0x10,uVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," Number of actions=",0x13);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        return (BaseState<true> *)0x0;
      }
      ctx->ex = ppeVar2[(ulong)uVar1 + 1];
      (ctx->label_index_state).index = -1;
    }
    LabelObjectState<true>::EndObject(&ctx->label_object_state,ctx,memberCount);
  }
  if ((ctx->namespace_path).super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (ctx->namespace_path).super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pBVar3 = ctx->root_state;
  }
  return pBVar3;
}

Assistant:

BaseState<audit>* EndObject(Context<audit>& ctx, rapidjson::SizeType memberCount)
  {
    BaseState<audit>* return_state = ctx.PopNamespace();

    if (ctx.namespace_path.empty())
    {
      int label_index = ctx.label_index_state.index;
      // we're at the end of the example
      if (label_index >= 0)
      {
        // skip shared example
        label_index++;
        if (label_index >= (int)ctx.examples->size())
        {
          ctx.error() << "Out of bounds error: _labelIndex must be smaller than number of actions! _labelIndex="
                      << (label_index - 1) << " Number of actions=" << ctx.examples->size() - 1 << " ";
          return nullptr;
        }

        // apply labelIndex
        ctx.ex = (*ctx.examples)[label_index];

        // reset for next example
        ctx.label_index_state.index = -1;
      }

      // inject label
      ctx.label_object_state.EndObject(ctx, memberCount);
    }

    // if we're at the top-level go back to ds_state
    return ctx.namespace_path.empty() ? ctx.root_state : return_state;
  }